

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

CK_RV __thiscall Token::setSOPIN(Token *this,ByteString *oldPIN,ByteString *newPIN)

{
  ObjectStoreToken *pOVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  SecureDataManager *this_00;
  CK_RV CVar5;
  CK_ULONG flags;
  ByteString soPINBlob;
  ByteString userPINBlob;
  MutexLocker lock;
  
  MutexLocker::MutexLocker(&lock,this->tokenMutex);
  CVar5 = 5;
  if (this->sdm != (SecureDataManager *)0x0) {
    iVar4 = (*this->token->_vptr_ObjectStoreToken[4])(this->token,&flags);
    if ((char)iVar4 == '\0') {
      softHSMLog(3,"setSOPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/slot_mgr/Token.cpp"
                 ,0x10a,"Could not get the token flags");
    }
    else {
      this_00 = (SecureDataManager *)operator_new(0xd0);
      SecureDataManager::getSOPINBlob(&soPINBlob,this->sdm);
      SecureDataManager::getUserPINBlob(&userPINBlob,this->sdm);
      SecureDataManager::SecureDataManager(this_00,&soPINBlob,&userPINBlob);
      ByteString::~ByteString(&userPINBlob);
      ByteString::~ByteString(&soPINBlob);
      bVar2 = SecureDataManager::loginSO(this_00,oldPIN);
      (*this_00->_vptr_SecureDataManager[1])(this_00);
      if (bVar2) {
        bVar2 = SecureDataManager::setSOPIN(this->sdm,newPIN);
        if (bVar2) {
          pOVar1 = this->token;
          SecureDataManager::getSOPINBlob(&soPINBlob,this->sdm);
          iVar4 = (**pOVar1->_vptr_ObjectStoreToken)(pOVar1,&soPINBlob);
          ByteString::~ByteString(&soPINBlob);
          if ((char)iVar4 != '\0') {
            ByteString::ByteString(&soPINBlob);
            ByteString::ByteString(&userPINBlob);
            iVar4 = (*this->token->_vptr_ObjectStoreToken[1])(this->token,&soPINBlob);
            if ((char)iVar4 == '\0') {
              uVar3 = false;
            }
            else {
              iVar4 = (*this->token->_vptr_ObjectStoreToken[3])(this->token,&userPINBlob);
              uVar3 = (undefined1)iVar4;
            }
            this->valid = (bool)uVar3;
            flags = flags & 0xffffffffffefffff;
            (*this->token->_vptr_ObjectStoreToken[5])();
            ByteString::~ByteString(&userPINBlob);
            ByteString::~ByteString(&soPINBlob);
            CVar5 = 0;
          }
        }
      }
      else {
        flags = flags | 0x100000;
        CVar5 = 0xa0;
        (*this->token->_vptr_ObjectStoreToken[5])();
      }
    }
  }
  MutexLocker::~MutexLocker(&lock);
  return CVar5;
}

Assistant:

CK_RV Token::setSOPIN(ByteString& oldPIN, ByteString& newPIN)
{
	CK_ULONG flags;

	// Lock access to the token
	MutexLocker lock(tokenMutex);

	if (sdm == NULL) return CKR_GENERAL_ERROR;

	// Get token flags
	if (!token->getTokenFlags(flags))
	{
		ERROR_MSG("Could not get the token flags");
		return CKR_GENERAL_ERROR;
	}

	// Verify oldPIN
	SecureDataManager* verifier = new SecureDataManager(sdm->getSOPINBlob(), sdm->getUserPINBlob());
	bool result = verifier->loginSO(oldPIN);
	delete verifier;
	if (result == false)
	{
		flags |= CKF_SO_PIN_COUNT_LOW;
		token->setTokenFlags(flags);
		return CKR_PIN_INCORRECT;
	}

	if (sdm->setSOPIN(newPIN) == false) return CKR_GENERAL_ERROR;

	// Save PIN to token file
	if (token->setSOPIN(sdm->getSOPINBlob()) == false) return CKR_GENERAL_ERROR;

	ByteString soPINBlob, userPINBlob;
	valid = token->getSOPIN(soPINBlob) && token->getUserPIN(userPINBlob);

	flags &= ~CKF_SO_PIN_COUNT_LOW;
	token->setTokenFlags(flags);

	return CKR_OK;
}